

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

SpikesConsumer * __thiscall
AbstractModuleClient::subscribeSpikeData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ntrodes)

{
  char *pcVar1;
  SubType SVar2;
  network_pimpl *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  SpikesConsumer *this_01;
  int np;
  ulong uVar6;
  NTrodeObj *nt;
  pointer this_02;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined1 local_4a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  int local_468;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> local_3c0;
  undefined1 local_3a8 [144];
  SubType local_318;
  undefined4 uStack_314;
  hfs_data_callback_fn p_Stack_310;
  void *pvStack_308;
  string local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  HFParsingInfo local_2c8;
  HighFreqDataType local_288;
  HighFreqDataType local_1f8;
  HighFreqDataType local_168;
  HFSubSockSettings local_d8;
  
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"spikestream","");
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Trodes","");
  bVar5 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_3e0,&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"spikestream","");
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Trodes","");
    this_01 = (SpikesConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_420,&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    pcVar1 = local_3a8 + 0x10;
    local_3a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"spikestream","");
    local_4a0._0_8_ = local_4a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Trodes","");
    network_pimpl::find_hfdt(&local_288,this_00,(string *)local_3a8,(string *)local_4a0);
    if ((undefined1 *)local_4a0._0_8_ != local_4a0 + 0x10) {
      operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
    }
    if ((char *)local_3a8._0_8_ != pcVar1) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    bVar5 = HighFreqDataType::isValid(&local_288);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2e0,ntrodes);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_300,&local_288);
      MlmWrap::createSpikesParsingInfo
                ((HFParsingInfo *)local_4a0,&this->super_MlmWrap,&local_2e0,&local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e0);
      MlmWrap::getTrodesConfig((TrodesConfig *)local_3a8,&this->super_MlmWrap);
      TrodesConfig::getNTrodes(&local_3c0,(TrodesConfig *)local_3a8);
      TrodesConfig::~TrodesConfig((TrodesConfig *)local_3a8);
      if (local_3c0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_3c0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        np = 0;
      }
      else {
        uVar6 = 0;
        this_02 = local_3c0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          NTrodeObj::getHw_chans((vector<int,_std::allocator<int>_> *)local_3a8,this_02);
          uVar4 = local_3a8._8_8_;
          uVar3 = local_3a8._0_8_;
          if ((char *)local_3a8._0_8_ != (char *)0x0) {
            operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
          }
          if (uVar6 < (ulong)((long)(uVar4 - uVar3) >> 2)) {
            NTrodeObj::getHw_chans((vector<int,_std::allocator<int>_> *)local_3a8,this_02);
            uVar4 = local_3a8._8_8_;
            uVar3 = local_3a8._0_8_;
            if ((char *)local_3a8._0_8_ != (char *)0x0) {
              operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
            }
            uVar6 = (long)(uVar4 - uVar3) >> 2;
          }
          this_02 = this_02 + 1;
        } while (this_02 !=
                 local_3c0.super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        np = (int)uVar6 * 0x28;
      }
      std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector(&local_3c0);
      this_01 = (SpikesConsumer *)operator_new(0x420);
      HighFreqDataType::HighFreqDataType(&local_168,&local_288);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_2c8.indices,(vector<int,_std::allocator<int>_> *)local_4a0);
      local_2c8.sizeOf = local_4a0._24_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2c8.dataRequested,&local_480);
      local_2c8.dataLength = local_468;
      SpikesConsumer::SpikesConsumer(this_01,&local_168,(int)buffersize,&local_2c8,np);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8.dataRequested);
      if (local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      HighFreqDataType::~HighFreqDataType(&local_168);
      HighFreqDataType::HighFreqDataType(&local_1f8,&local_288);
      SVar2 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_3a8,&local_1f8);
      p_Stack_310 = (hfs_data_callback_fn)0x0;
      pvStack_308 = (void *)0x0;
      local_318 = SVar2;
      HighFreqDataType::~HighFreqDataType(&local_1f8);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HighFreqDataType::HighFreqDataType(&local_d8.dataType,(HighFreqDataType *)local_3a8);
      local_d8.args = pvStack_308;
      local_d8._148_4_ = uStack_314;
      local_d8.subSockType = local_318;
      local_d8.userFoo = p_Stack_310;
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d8);
      HighFreqDataType::~HighFreqDataType(&local_d8.dataType);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_480);
      if ((pointer)local_4a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ - local_4a0._0_8_);
      }
    }
    else {
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_460,"Spikes data could not be found on the network!","");
      MlmWrap::error((string *)local_3a8,&this->super_MlmWrap,&local_460);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)local_3a8._0_8_,local_3a8._8_8_);
      if ((char *)local_3a8._0_8_ != pcVar1) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      this_01 = (SpikesConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_288);
  }
  return this_01;
}

Assistant:

SpikesConsumer* AbstractModuleClient::subscribeSpikeData(size_t buffersize, std::vector<std::string> ntrodes){
    if(isHfTypeCurrentlySubbed(hfType_SPIKE, TRODES_NETWORK_ID)){
        return (SpikesConsumer*)getHfSubObject(hfType_SPIKE, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_SPIKE, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Spikes data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createSpikesParsingInfo(ntrodes, dt.getDataFormat());
    size_t max_nchans = 0;
    for(auto const& nt : getTrodesConfig().getNTrodes()){
        if(nt.getHw_chans().size() > max_nchans){
            max_nchans = nt.getHw_chans().size();
        }
    }
    SpikesConsumer* newsub = new SpikesConsumer(dt, buffersize, parseinfo, max_nchans*POINTS_IN_WAVE);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}